

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_mesh.cpp
# Opt level: O2

Read<double> __thiscall
Omega_h::Mesh::sync_subset_array<double>
          (Mesh *this,Int ent_dim,Read<double> *a_data,LOs *a2e,double default_val,Int width)

{
  bool bVar1;
  LO nb;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *pvVar2;
  undefined4 in_register_00000034;
  undefined4 in_register_00000084;
  Int in_R9D;
  Read<double> RVar3;
  Read<double> e_data;
  Write<double> WStack_c8;
  Mesh *local_b8;
  Write<int> *local_b0;
  double local_a8;
  Write<double> local_a0;
  Write<int> local_90;
  Write<double> local_80;
  Write<double> local_70;
  Write<int> local_60;
  Write<double> local_50;
  
  local_a8 = default_val;
  bVar1 = could_be_shared((Mesh *)CONCAT44(in_register_00000034,ent_dim),(Int)a_data);
  if (bVar1) {
    local_b8 = this;
    Write<double>::Write(&local_50,(Write<double> *)a2e);
    local_b0 = (Write<int> *)CONCAT44(in_register_00000084,width);
    Write<int>::Write(&local_60,(Write<int> *)CONCAT44(in_register_00000084,width));
    nb = nents((Mesh *)CONCAT44(in_register_00000034,ent_dim),(Int)a_data);
    map_onto<double>((Omega_h *)&WStack_c8,(Read<signed_char> *)&local_50,(LOs *)&local_60,nb,
                     local_a8,in_R9D);
    Write<int>::~Write(&local_60);
    Write<double>::~Write(&local_50);
    Write<double>::Write(&local_70,&WStack_c8);
    sync_array<double>((Mesh *)&stack0xffffffffffffffc0,ent_dim,
                       (Read<double> *)((ulong)a_data & 0xffffffff),(Int)&local_70);
    Write<double>::operator=(&WStack_c8,(Write<signed_char> *)&stack0xffffffffffffffc0);
    Write<double>::~Write((Write<double> *)&stack0xffffffffffffffc0);
    Write<double>::~Write(&local_70);
    Write<int>::Write(&local_90,local_b0);
    Write<double>::Write(&local_a0,&WStack_c8);
    unmap<double>((Omega_h *)&local_80,(LOs *)&local_90,(Read<signed_char> *)&local_a0,in_R9D);
    this = local_b8;
    Read<double>::Read((Read<signed_char> *)local_b8,&local_80);
    Write<double>::~Write(&local_80);
    Write<double>::~Write(&local_a0);
    Write<int>::~Write(&local_90);
    Write<double>::~Write(&WStack_c8);
    pvVar2 = extraout_RDX;
  }
  else {
    Write<double>::Write((Write<signed_char> *)this,(Write<signed_char> *)a2e);
    pvVar2 = extraout_RDX_00;
  }
  RVar3.write_.shared_alloc_.direct_ptr = pvVar2;
  RVar3.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<double>)RVar3.write_.shared_alloc_;
}

Assistant:

Read<T> Mesh::sync_subset_array(
    Int ent_dim, Read<T> a_data, LOs a2e, T default_val, Int width) {
  if (!could_be_shared(ent_dim)) return a_data;
  auto e_data = map_onto(a_data, a2e, nents(ent_dim), default_val, width);
  e_data = sync_array(ent_dim, e_data, width);
  return unmap(a2e, e_data, width);
}